

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O0

Entry * cali::Entry::unpack(Entry *__return_storage_ptr__,CaliperMetadataAccessInterface *db,
                           uchar *buffer,size_t *inc)

{
  int iVar1;
  uint64_t uVar2;
  undefined4 extraout_var;
  cali_id_t cVar3;
  Variant VVar4;
  uint64_t local_38;
  anon_union_8_7_33918203_for_value local_30;
  size_t local_28;
  size_t p;
  size_t *inc_local;
  uchar *buffer_local;
  CaliperMetadataAccessInterface *db_local;
  
  local_28 = 0;
  p = (size_t)inc;
  inc_local = (size_t *)buffer;
  buffer_local = (uchar *)db;
  uVar2 = vldec_u64(buffer,&local_28);
  iVar1 = (**db->_vptr_CaliperMetadataAccessInterface)(db,uVar2);
  Entry(__return_storage_ptr__,(Node *)CONCAT44(extraout_var,iVar1));
  cVar3 = Node::attribute(__return_storage_ptr__->m_node);
  if (cVar3 == 8) {
    VVar4 = Variant::unpack((uchar *)((long)inc_local + local_28),&local_28,(bool *)0x0);
    local_38 = VVar4.m_v.type_and_size;
    (__return_storage_ptr__->m_value).m_v.type_and_size = local_38;
    local_30 = VVar4.m_v.value;
    (__return_storage_ptr__->m_value).m_v.value.v_uint = (uint64_t)local_30;
  }
  if (p != 0) {
    *(size_t *)p = local_28 + *(long *)p;
  }
  return __return_storage_ptr__;
}

Assistant:

Entry Entry::unpack(const CaliperMetadataAccessInterface& db, const unsigned char* buffer, size_t* inc)
{
    size_t p = 0;
    Entry  ret { db.node(vldec_u64(buffer, &p)) };

    if (ret.m_node->attribute() == Attribute::NAME_ATTR_ID)
        ret.m_value = Variant::unpack(buffer + p, &p);

    if (inc)
        *inc += p;

    return ret;
}